

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_json.cc
# Opt level: O2

bare_handler_t * __thiscall
anon_unknown.dwarf_3a0445::Handlers::bindBare
          (bare_handler_t *__return_storage_ptr__,Handlers *this,offset_in_Handlers_to_subr f)

{
  offset_in_Handlers_to_subr *poVar1;
  
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  poVar1 = (offset_in_Handlers_to_subr *)operator_new(0x18);
  *poVar1 = f;
  poVar1[1] = 0;
  poVar1[2] = (offset_in_Handlers_to_subr)this;
  *(offset_in_Handlers_to_subr **)&(__return_storage_ptr__->super__Function_base)._M_functor =
       poVar1;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
       ::_M_manager;
  return __return_storage_ptr__;
}

Assistant:

Handlers::bare_handler_t
Handlers::bindBare(void (Handlers::*f)())
{
    return std::bind(std::mem_fn(f), this);
}